

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void greetable_proxy_init(GreetableProxy *proxy)

{
  GreetableProxyPrivate *pGVar1;
  undefined8 uVar2;
  GDBusInterfaceInfo *pGVar3;
  GreetableProxy *proxy_local;
  
  pGVar1 = (GreetableProxyPrivate *)greetable_proxy_get_instance_private(proxy);
  proxy->priv = pGVar1;
  uVar2 = g_dbus_proxy_get_type();
  uVar2 = g_type_check_instance_cast(proxy,uVar2);
  pGVar3 = greetable_interface_info();
  g_dbus_proxy_set_interface_info(uVar2,pGVar3);
  return;
}

Assistant:

static void
greetable_proxy_init (GreetableProxy *proxy)
{
#if GLIB_VERSION_MAX_ALLOWED >= GLIB_VERSION_2_38
  proxy->priv = greetable_proxy_get_instance_private (proxy);
#else
  proxy->priv = G_TYPE_INSTANCE_GET_PRIVATE (proxy, TYPE_GREETABLE_PROXY, GreetableProxyPrivate);
#endif

  g_dbus_proxy_set_interface_info (G_DBUS_PROXY (proxy), greetable_interface_info ());
}